

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *buf_ptr;
  ptrdiff_t _Num;
  size_t sVar9;
  ulong uVar10;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_01;
  format_int local_58;
  
  pcVar7 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar5 = strlen(pcVar7);
  sVar9 = (dest->super_buffer<char>).size_ + sVar5;
  if ((dest->super_buffer<char>).capacity_ < sVar9) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar9);
  }
  if (sVar5 != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar5);
  }
  (dest->super_buffer<char>).size_ = sVar9;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ' ';
  pcVar7 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar5 = strlen(pcVar7);
  sVar9 = (dest->super_buffer<char>).size_ + sVar5;
  if ((dest->super_buffer<char>).capacity_ < sVar9) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar9);
  }
  if (sVar5 != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar5);
  }
  (dest->super_buffer<char>).size_ = sVar9;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar6 = fmt::v6::format_int::format_decimal(&local_58,(ulong)uVar3);
  pcVar7 = pcVar6;
  if ((int)uVar1 < 0) {
    pcVar7 = pcVar6 + -1;
    pcVar6[-1] = '-';
  }
  pcVar6 = local_58.buffer_ + 0x15;
  sVar9 = (dest->super_buffer<char>).size_ + ((long)pcVar6 - (long)pcVar7);
  local_58.str_ = pcVar7;
  if ((dest->super_buffer<char>).capacity_ < sVar9) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar9);
  }
  if (pcVar6 != pcVar7) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,
            (long)pcVar6 - (long)pcVar7);
  }
  (dest->super_buffer<char>).size_ = sVar9;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ' ';
  uVar1 = tm_time->tm_hour;
  if ((ulong)uVar1 < 100) {
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar10) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar9 = (dest->super_buffer<char>).size_;
      uVar10 = sVar9 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar10;
    (dest->super_buffer<char>).ptr_[sVar9] = bVar4 | 0x30;
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar10) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar9 = (dest->super_buffer<char>).size_;
      uVar10 = sVar9 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar10;
    (dest->super_buffer<char>).ptr_[sVar9] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    format_str.size_ = 5;
    format_str.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)&local_58;
    args.types_ = 2;
    local_58.buffer_._0_8_ = (ulong)uVar1;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str,args,(locale_ref)0x0);
  }
  sVar9 = (dest->super_buffer<char>).size_;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ':';
  uVar1 = tm_time->tm_min;
  if ((ulong)uVar1 < 100) {
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar10) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar9 = (dest->super_buffer<char>).size_;
      uVar10 = sVar9 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar10;
    (dest->super_buffer<char>).ptr_[sVar9] = bVar4 | 0x30;
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar10) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar9 = (dest->super_buffer<char>).size_;
      uVar10 = sVar9 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar10;
    (dest->super_buffer<char>).ptr_[sVar9] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    format_str_00.size_ = 5;
    format_str_00.data_ = "{:02}";
    args_00.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)&local_58;
    args_00.types_ = 2;
    local_58.buffer_._0_8_ = (ulong)uVar1;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str_00,args_00,(locale_ref)0x0);
  }
  sVar9 = (dest->super_buffer<char>).size_;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ':';
  uVar1 = tm_time->tm_sec;
  if ((ulong)uVar1 < 100) {
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar10) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar9 = (dest->super_buffer<char>).size_;
      uVar10 = sVar9 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar10;
    (dest->super_buffer<char>).ptr_[sVar9] = bVar4 | 0x30;
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar10) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar9 = (dest->super_buffer<char>).size_;
      uVar10 = sVar9 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar10;
    (dest->super_buffer<char>).ptr_[sVar9] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    format_str_01.size_ = 5;
    format_str_01.data_ = "{:02}";
    args_01.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)&local_58;
    args_01.types_ = 2;
    local_58.buffer_._0_8_ = (ulong)uVar1;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str_01,args_01,(locale_ref)0x0);
  }
  sVar9 = (dest->super_buffer<char>).size_;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ' ';
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar8 = fmt::v6::format_int::format_decimal(&local_58,(ulong)uVar3);
  pcVar7 = pcVar8;
  if (iVar2 < -0x76c) {
    pcVar7 = pcVar8 + -1;
    pcVar8[-1] = '-';
  }
  uVar10 = (dest->super_buffer<char>).size_ + ((long)pcVar6 - (long)pcVar7);
  local_58.str_ = pcVar7;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar10);
  }
  if (pcVar6 != pcVar7) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,
            (long)pcVar6 - (long)pcVar7);
  }
  (dest->super_buffer<char>).size_ = uVar10;
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }